

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O1

bool __thiscall r_exec::HLPContext::evaluate_no_dereference(HLPContext *this,uint16_t *result_index)

{
  _func_bool_Context_ptr_uint16_t_ptr *p_Var1;
  _func_bool_Context_ptr_uint16_t_ptr *p_Var2;
  Atom *pAVar3;
  BindingMap *this_00;
  uint16_t *puVar4;
  bool bVar5;
  uint8_t id;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  Operator *pOVar9;
  Atom *intermediate_results;
  uint uVar10;
  ushort uVar11;
  byte bVar12;
  uint16_t unused_result_index;
  Context _c;
  uint16_t local_7a;
  uint16_t *local_78;
  HLPContext local_70;
  HLPContext local_50;
  
  uVar10 = (this->super__Context).data - VALUE_ARRAY;
  if (uVar10 < 3) {
    bVar12 = 3 >> ((byte)uVar10 & 7);
  }
  else {
    bVar12 = r_code::Atom::getDescriptor();
    uVar10 = bVar12 - 0xc1;
    if (uVar10 < 0xe) {
      local_78 = result_index;
      if ((0x3f8fU >> (uVar10 & 0x1f) & 1) != 0) {
        iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
        uVar6 = (ushort)iVar8;
        bVar12 = uVar6 == 0;
        if (!(bool)bVar12) {
          uVar11 = 1;
          do {
            HLPContext(&local_50,(this->super__Context).code,(this->super__Context).index + uVar11,
                       (HLPOverlay *)(this->super__Context).overlay,STEM);
            operator*(&local_70,&local_50);
            bVar5 = evaluate_no_dereference(&local_70,&local_7a);
            if (!bVar5) goto LAB_00175bb3;
            uVar11 = uVar11 + 1;
            bVar12 = uVar6 < uVar11;
          } while (uVar11 <= uVar6);
        }
        *local_78 = (this->super__Context).index;
        goto LAB_00175c80;
      }
      if (uVar10 == 4) {
        iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
        if ((ushort)iVar8 != 0) {
          uVar6 = 1;
          do {
            HLPContext(&local_50,(this->super__Context).code,(this->super__Context).index + uVar6,
                       (HLPOverlay *)(this->super__Context).overlay,STEM);
            operator*(&local_70,&local_50);
            bVar5 = evaluate_no_dereference(&local_70,&local_7a);
            if (!bVar5) goto LAB_00175bb3;
            uVar6 = uVar6 + 1;
          } while (uVar6 <= (ushort)iVar8);
        }
        uVar6 = r_code::Atom::asOpcode();
        pOVar9 = r_code::vector<r_exec::Operator>::operator[]
                           ((vector<r_exec::Operator> *)Operator::Operators,(ulong)uVar6);
        p_Var1 = pOVar9->_operator;
        p_Var2 = pOVar9->_overload;
        local_70.super__Context.overlay = (Overlay *)operator_new(0x20);
        puVar4 = local_78;
        ((local_70.super__Context.overlay)->super__Object)._vptr__Object =
             (_func_int **)&PTR___Context_001be470;
        pAVar3 = (this->super__Context).code;
        ((local_70.super__Context.overlay)->super__Object).refCount.super___atomic_base<long>._M_i =
             (__int_type)(this->super__Context).overlay;
        ((local_70.super__Context.overlay)->invalidated).super___atomic_base<unsigned_long>._M_i =
             (__int_type_conflict)pAVar3;
        (local_70.super__Context.overlay)->controller =
             *(Controller **)&(this->super__Context).index;
        ((local_70.super__Context.overlay)->super__Object)._vptr__Object =
             (_func_int **)&PTR___Context_001c0008;
        local_70.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be4c8;
        bVar5 = (*p_Var1)((Context *)&local_70,local_78);
        bVar12 = true;
        if (!bVar5) {
          if (p_Var2 == (_func_bool_Context_ptr_uint16_t_ptr *)0x0) {
            bVar12 = false;
          }
          else {
            bVar12 = (*p_Var2)((Context *)&local_70,puVar4);
          }
        }
        local_70.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be4c8;
        if (local_70.super__Context.overlay != (Overlay *)0x0) {
          (*((local_70.super__Context.overlay)->super__Object)._vptr__Object[1])();
        }
        goto LAB_00175c80;
      }
    }
    if (bVar12 == 0x8d) {
      pAVar3 = (this->super__Context).code;
      uVar7 = r_code::Atom::asIndex();
      HLPContext(&local_70,pAVar3,uVar7,(HLPOverlay *)(this->super__Context).overlay,STEM);
      bVar12 = evaluate_no_dereference(&local_70,result_index);
      if ((bool)bVar12) {
        pAVar3 = (this->super__Context).code;
        this_00 = (BindingMap *)(this->super__Context).overlay[1].super__Object._vptr__Object;
        id = r_code::Atom::asAssignmentIndex();
        uVar7 = r_code::Atom::asIndex();
        intermediate_results =
             r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
        BindingMap::bind_variable(this_00,pAVar3,id,uVar7,intermediate_results);
      }
    }
    else {
      *result_index = (this->super__Context).index;
      bVar12 = 1;
    }
  }
  goto LAB_00175c80;
LAB_00175bb3:
  bVar12 = 0;
LAB_00175c80:
  return (bool)(bVar12 & 1);
}

Assistant:

bool HLPContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case VALUE_ARRAY:
    case BINDING_MAP:
        return true;

    case UNDEFINED:
        return false;

    default:
        break;
    }

    switch (code[index].getDescriptor()) {
    case Atom::ASSIGN_PTR: {
        HLPContext c(code, code[index].asIndex(), (HLPOverlay *)overlay);

        if (c.evaluate_no_dereference(result_index)) {
            ((HLPOverlay *)overlay)->bindings->bind_variable(code, code[index].asAssignmentIndex(), code[index].asIndex(), &overlay->values[0]);
            return true;
        } else {
            return false;
        }
    }

    case Atom::OPERATOR: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        Operator op = Operator::Get((*this)[0].asOpcode());
        HLPContext *c = new HLPContext(*this);
        Context _c(c);
        return op(_c, result_index);
    }

    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}